

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O1

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted,Array4<const_double> *eb_velocity,
               Array4<const_double> *values_on_eb_inflow,Array4<const_amrex::EBCellFlag> *flag_arr,
               Array4<const_double> *barea,Array4<const_double> *bnorm)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  EBCellFlag *pEVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  uint32_t *puVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  bool bVar66;
  double *local_158;
  double *local_150;
  
  EB_ComputeDivergence(bx,div,fx,fy,fz,vfrac,ncomp,geom,mult,fluxes_are_area_weighted);
  pdVar24 = eb_velocity->p;
  if ((pdVar24 != (double *)0x0) && (0 < ncomp)) {
    dVar4 = (geom->super_CoordSys).inv_dx[0];
    lVar25 = div->jstride;
    lVar26 = barea->jstride;
    iVar5 = (barea->begin).y;
    iVar6 = (bx->smallend).vect[1];
    lVar63 = (long)iVar6;
    iVar7 = (bx->smallend).vect[0];
    lVar61 = (long)iVar7;
    lVar3 = lVar61 * 8;
    iVar8 = (barea->begin).x;
    lVar27 = values_on_eb_inflow->jstride;
    iVar9 = (vfrac->begin).y;
    lVar28 = vfrac->jstride;
    iVar10 = (vfrac->begin).x;
    lVar1 = lVar3 + (lVar63 - (bnorm->begin).y) * bnorm->jstride * 8;
    lVar29 = bnorm->nstride;
    lVar58 = (long)(bnorm->begin).x;
    pdVar30 = bnorm->p;
    lVar2 = lVar3 + (lVar63 - (eb_velocity->begin).y) * eb_velocity->jstride * 8;
    lVar31 = eb_velocity->nstride;
    lVar49 = (long)(eb_velocity->begin).x;
    iVar11 = (flag_arr->begin).y;
    lVar32 = flag_arr->jstride;
    iVar12 = (flag_arr->begin).x;
    local_150 = div->p + (((lVar63 - (div->begin).y) * lVar25 + lVar61) - (long)(div->begin).x);
    lVar33 = div->kstride;
    lVar34 = div->nstride;
    iVar13 = (div->begin).z;
    lVar35 = eb_velocity->kstride;
    iVar14 = (eb_velocity->begin).z;
    local_158 = values_on_eb_inflow->p +
                (((lVar63 - (values_on_eb_inflow->begin).y) * lVar27 + lVar61) -
                (long)(values_on_eb_inflow->begin).x);
    lVar36 = values_on_eb_inflow->kstride;
    lVar37 = values_on_eb_inflow->nstride;
    iVar15 = (values_on_eb_inflow->begin).z;
    pEVar38 = flag_arr->p;
    lVar39 = flag_arr->kstride;
    iVar16 = (flag_arr->begin).z;
    pdVar40 = barea->p;
    lVar41 = barea->kstride;
    iVar17 = (barea->begin).z;
    pdVar42 = vfrac->p;
    lVar43 = vfrac->kstride;
    iVar18 = (vfrac->begin).z;
    lVar44 = bnorm->kstride;
    iVar19 = (bnorm->begin).z;
    iVar20 = (bx->smallend).vect[2];
    iVar21 = (bx->bigend).vect[2];
    iVar22 = (bx->bigend).vect[0];
    iVar23 = (bx->bigend).vect[1];
    lVar45 = bnorm->jstride * 8;
    lVar46 = eb_velocity->jstride * 8;
    uVar52 = 0;
    do {
      iVar47 = iVar20;
      if (iVar20 <= iVar21) {
        do {
          if (iVar6 <= iVar23) {
            lVar53 = (long)iVar47;
            pdVar59 = (double *)((lVar53 - iVar13) * lVar33 * 8 + (long)local_150);
            lVar56 = (long)pdVar40 +
                     (lVar53 - iVar17) * lVar41 * 8 +
                     lVar3 + (lVar63 - iVar5) * lVar26 * 8 + (long)iVar8 * -8;
            pdVar62 = (double *)((lVar53 - iVar15) * lVar36 * 8 + (long)local_158);
            lVar48 = (long)pdVar42 +
                     (lVar53 - iVar18) * lVar43 * 8 +
                     lVar3 + (lVar63 - iVar9) * lVar28 * 8 + (long)iVar10 * -8;
            lVar50 = (lVar53 - iVar19) * lVar44 * 8;
            lVar57 = (long)pdVar30 + lVar50 + lVar29 * 0x10 + lVar1 + lVar58 * -8;
            lVar60 = (long)pdVar30 + lVar50 + lVar1 + lVar29 * 8 + lVar58 * -8;
            lVar51 = (long)pdVar30 + lVar50 + lVar1 + lVar58 * -8;
            lVar50 = (lVar53 - iVar14) * lVar35 * 8;
            lVar55 = (long)pdVar24 + lVar50 + lVar31 * 0x10 + lVar2 + lVar49 * -8;
            lVar65 = (long)pdVar24 + lVar50 + lVar2 + lVar31 * 8 + lVar49 * -8;
            lVar64 = (long)pdVar24 + lVar50 + lVar2 + lVar49 * -8;
            puVar54 = (uint32_t *)
                      ((long)&pEVar38[((lVar63 - iVar11) * lVar32 + lVar61) - (long)iVar12].flag +
                      (lVar53 - iVar16) * lVar39 * 4);
            lVar50 = lVar63;
            do {
              if (iVar7 <= iVar22) {
                lVar53 = 0;
                do {
                  if ((puVar54[lVar53] & 3) == 1) {
                    pdVar59[lVar53] =
                         (mult / *(double *)(lVar48 + lVar53 * 8)) * pdVar62[lVar53] *
                         (*(double *)(lVar55 + lVar53 * 8) * *(double *)(lVar57 + lVar53 * 8) +
                         *(double *)(lVar64 + lVar53 * 8) * *(double *)(lVar51 + lVar53 * 8) +
                         *(double *)(lVar65 + lVar53 * 8) * *(double *)(lVar60 + lVar53 * 8)) *
                         *(double *)(lVar56 + lVar53 * 8) * dVar4 + pdVar59[lVar53];
                  }
                  lVar53 = lVar53 + 1;
                } while ((iVar22 - iVar7) + 1 != (int)lVar53);
              }
              lVar50 = lVar50 + 1;
              pdVar59 = pdVar59 + lVar25;
              lVar56 = lVar56 + lVar26 * 8;
              pdVar62 = pdVar62 + lVar27;
              lVar48 = lVar48 + lVar28 * 8;
              lVar57 = lVar57 + lVar45;
              lVar60 = lVar60 + lVar45;
              lVar51 = lVar51 + lVar45;
              lVar55 = lVar55 + lVar46;
              lVar65 = lVar65 + lVar46;
              lVar64 = lVar64 + lVar46;
              puVar54 = puVar54 + lVar32;
            } while (iVar23 + 1 != (int)lVar50);
          }
          bVar66 = iVar47 != iVar21;
          iVar47 = iVar47 + 1;
        } while (bVar66);
      }
      uVar52 = uVar52 + 1;
      local_150 = local_150 + lVar34;
      local_158 = local_158 + lVar37;
    } while (uVar52 != (uint)ncomp);
  }
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted,
                                   Array4<Real const> const& eb_velocity,
                                   Array4<Real const> const& values_on_eb_inflow,
                                   Array4<EBCellFlag const> const& flag_arr,
                                   Array4<Real const> const& barea,
                                   Array4<Real const> const& bnorm)
{

    // Compute the standard EB divergence term
    EB_ComputeDivergence(bx, div, AMREX_D_DECL(fx, fy, fz),
                         vfrac, ncomp, geom, mult, fluxes_are_area_weighted);

    if( eb_velocity ) {

        AMREX_ASSERT( values_on_eb_inflow );

        const auto &dxinv = geom.InvCellSizeArray();

        amrex::ParallelFor(bx, ncomp, [div,eb_velocity,values_on_eb_inflow,
          flag_arr,barea,vfrac,bnorm,dxinv,mult]
          AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
         if (flag_arr(i,j,k).isSingleValued()) {

           Real Ueb_dot_n = (AMREX_D_TERM(
                                eb_velocity(i,j,k,0)*bnorm(i,j,k,0),
                              + eb_velocity(i,j,k,1)*bnorm(i,j,k,1),
                              + eb_velocity(i,j,k,2)*bnorm(i,j,k,2)));

           div(i,j,k,n) += (mult / vfrac(i,j,k)) *
              values_on_eb_inflow(i,j,k,n) * Ueb_dot_n * barea(i,j,k) * dxinv[0];

         }
        });
     }
}